

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O2

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen9TextureCalc::Get2DTexOffsetAddressPerMip
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  uint32_t Width;
  uint32_t uVar2;
  uint uVar3;
  uint32_t Height;
  ulong uVar4;
  GMM_GFX_SIZE_T GVar5;
  int iVar6;
  uint uVar7;
  ulong uStack_70;
  uint32_t local_5c;
  GMM_PLATFORM_INFO *pGStack_58;
  uint32_t CompressDepth;
  uint local_50;
  uint local_4c;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  ulong local_40;
  uint local_38;
  uint8_t local_31;
  
  pGStack_58 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  uVar2 = (pTexInfo->Alignment).HAlign;
  CompressHeight = (pTexInfo->Alignment).VAlign;
  local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  Height = pTexInfo->BaseHeight;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&local_4c,&local_50,&local_5c);
  local_38 = MipLevel;
  if (((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) &&
     (local_38 = (pTexInfo->Alignment).MipTailStartLod, MipLevel <= local_38)) {
    local_38 = MipLevel;
  }
  CompressWidth = MipLevel;
  if (local_38 < 2) {
    local_40 = 0;
    goto LAB_001b1ce0;
  }
  local_40 = CONCAT44(local_40._4_4_,uVar2);
  uVar2 = 1;
  Width = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])(this,pTexInfo,1);
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
    uVar2 = (pTexInfo->MSAA).NumSamples;
  }
  uStack_70 = (ulong)pTexInfo->BitsPerPixel;
  uVar7 = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,Width,(uint32_t)local_40,uVar2);
  if (local_31 == '\0') {
    aVar1 = (pTexInfo->Flags).Gpu;
    if ((aVar1._0_4_ >> 0x1d & 1) == 0) {
      uVar4 = ~(ulong)aVar1 & 0x20000000002;
    }
    else {
      if ((~(ulong)aVar1 & 0x20000000002) != 0) goto LAB_001b1ccc;
      uVar4 = (ulong)(pTexInfo->Flags).Info & 0x400000000;
    }
    if (uVar4 == 0) {
      uVar2 = pTexInfo->BitsPerPixel;
      uStack_70 = 8;
      uVar4 = 8;
      if (uVar2 == 0x80) {
        uVar7 = uVar7 >> 1;
        uStack_70 = uVar4;
      }
      else if (uVar2 == 0x40) {
        uVar7 = uVar7 >> 2;
        uStack_70 = uVar4;
      }
      else if (uVar2 == 0x20) {
        uVar7 = uVar7 >> 3;
        uStack_70 = uVar4;
      }
    }
  }
  else {
    uVar7 = uVar7 / local_4c;
  }
LAB_001b1ccc:
  local_40 = uStack_70 * uVar7 >> 3;
LAB_001b1ce0:
  iVar6 = 0;
  for (uVar7 = 1; uVar7 <= local_38; uVar7 = uVar7 + 1) {
    uVar2 = 1;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar2 = (pTexInfo->MSAA).NumSamples;
    }
    uVar2 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,Height,CompressHeight,uVar2);
    if (local_31 == '\0') {
      aVar1 = (pTexInfo->Flags).Gpu;
      if (((aVar1._0_4_ >> 0x1d & 1) == 0) || (((ulong)(pTexInfo->Flags).Info & 0x400000000) == 0))
      {
        uVar3 = uVar2 >> 4;
        if ((~(ulong)aVar1 & 0x20000000002) != 0) {
          uVar3 = uVar2;
        }
      }
      else {
        uVar3 = uVar2 >> 1;
      }
    }
    else {
      uVar3 = uVar2 / local_50;
    }
    if (uVar7 == 2) {
      uVar3 = 0;
    }
    iVar6 = iVar6 + uVar3;
    Height = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar7);
  }
  uVar2 = pGStack_58->TileInfo[pTexInfo->TileMode].LogicalTileDepth;
  GVar5 = local_40 + (uVar2 + (uVar2 == 0)) * iVar6 * (int)pTexInfo->Pitch;
  if ((((ulong)(pTexInfo->Flags).Info & 0x106000000000) != 0) &&
     ((pTexInfo->Alignment).MipTailStartLod <= CompressWidth)) {
    uVar7 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[9])(this,pTexInfo);
    GVar5 = GVar5 + uVar7;
  }
  return GVar5;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmGen9TextureCalc::Get2DTexOffsetAddressPerMip(GMM_TEXTURE_INFO *pTexInfo,
                                                                       uint32_t          MipLevel)
{
    uint32_t       AlignedMipHeight, i, OffsetHeight;
    uint8_t        Compressed;
    uint32_t       HAlign, VAlign, __MipLevel;
    uint32_t       CompressHeight, CompressWidth, CompressDepth;
    uint32_t       MipHeight;
    GMM_GFX_SIZE_T MipOffset;

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    HAlign     = pTexInfo->Alignment.HAlign;
    VAlign     = pTexInfo->Alignment.VAlign;
    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    MipHeight    = pTexInfo->BaseHeight;
    OffsetHeight = 0;

    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    __MipLevel =
    (pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) ?
    GFX_MIN(MipLevel, pTexInfo->Alignment.MipTailStartLod) :
    MipLevel;

    if(__MipLevel < 2) // LOD0 and LOD1 are on the left edge...
    {
        MipOffset = 0;
    }
    else // LOD2 and beyond are to the right of LOD1...
    {
        uint32_t MipWidth     = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, 1));
        uint32_t BitsPerPixel = pTexInfo->BitsPerPixel;

        MipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

        if(Compressed)
        {
            MipWidth /= CompressWidth;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
	    //Expt: Stencil Row interleaving, where Rowheight = VALign=8
            //XOffset on interleaved row not different than w/o interleave.
            //MipWidth *= 2;	
	}
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            BitsPerPixel = 8; // Aux Surfaces are 8bpp

            switch(pTexInfo->BitsPerPixel)
            {
                case 32:
                    MipWidth /= 8;
                    break;
                case 64:
                    MipWidth /= 4;
                    break;
                case 128:
                    MipWidth /= 2;
                    break;
                default:
                    __GMM_ASSERT(0);
            }
        }

        MipOffset = (GMM_GFX_SIZE_T)MipWidth * BitsPerPixel >> 3;
    }

    for(i = 1; i <= __MipLevel; i++)
    {
        AlignedMipHeight = GFX_ULONG_CAST(__GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo));

        if(Compressed)
        {
            AlignedMipHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
            AlignedMipHeight /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            AlignedMipHeight /= 16;
        }

        OffsetHeight += ((i != 2) ? AlignedMipHeight : 0);

        MipHeight = GmmTexGetMipHeight(pTexInfo, i);
    }
    OffsetHeight *= GFX_MAX(pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth, 1);

    MipOffset += OffsetHeight * GFX_ULONG_CAST(pTexInfo->Pitch);

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       (MipLevel >= pTexInfo->Alignment.MipTailStartLod))
    {
        MipOffset += GetMipTailByteOffset(pTexInfo, MipLevel);
    }

    GMM_DPF_EXIT;
    return (MipOffset);
}